

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

char * afm_stream_read_one(AFM_Stream stream)

{
  byte *pbVar1;
  FT_Int FVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  
  afm_stream_skip_spaces(stream);
  if (stream->status < 1) {
    pbVar1 = stream->cursor + -1;
    pbVar3 = stream->cursor;
    do {
      while( true ) {
        uVar5 = 0xffffffff;
        pbVar4 = pbVar3;
        if (pbVar3 < stream->limit) {
          pbVar4 = pbVar3 + 1;
          stream->cursor = pbVar4;
          uVar5 = (uint)*pbVar3;
        }
        pbVar3 = pbVar4;
        if ((int)uVar5 < 0xd) break;
        if ((int)uVar5 < 0x20) {
          if (uVar5 == 0xd) goto LAB_0020c03a;
          if (uVar5 == 0x1a) {
LAB_0020c041:
            FVar2 = 3;
            goto LAB_0020c046;
          }
        }
        else {
          if (uVar5 == 0x20) {
            return (char *)pbVar1;
          }
          if (uVar5 == 0x3b) {
            FVar2 = 1;
            goto LAB_0020c046;
          }
        }
      }
      if (uVar5 == 0xffffffff) goto LAB_0020c041;
      if (uVar5 == 9) {
        return (char *)pbVar1;
      }
    } while (uVar5 != 10);
LAB_0020c03a:
    FVar2 = 2;
LAB_0020c046:
    stream->status = FVar2;
  }
  else {
    pbVar1 = (byte *)0x0;
  }
  return (char *)pbVar1;
}

Assistant:

static char*
  afm_stream_read_one( AFM_Stream  stream )
  {
    char*  str;


    afm_stream_skip_spaces( stream );
    if ( AFM_STATUS_EOC( stream ) )
      return NULL;

    str = AFM_STREAM_KEY_BEGIN( stream );

    while ( 1 )
    {
      int  ch = AFM_GETC();


      if ( AFM_IS_SPACE( ch ) )
        break;
      else if ( AFM_IS_NEWLINE( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOL;
        break;
      }
      else if ( AFM_IS_SEP( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOC;
        break;
      }
      else if ( AFM_IS_EOF( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOF;
        break;
      }
    }

    return str;
  }